

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  pointer *ppLVar1;
  pointer pLVar2;
  pointer pFVar3;
  pointer pTVar4;
  iterator __position;
  ulong uVar5;
  Index IVar6;
  Result RVar7;
  ulong uVar8;
  pointer pTVar9;
  TypeVector local_48;
  
  this->expr_loc_ = loc;
  pLVar2 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    (this->locals_).
    super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2;
  }
  uVar5 = (ulong)func_index;
  pFVar3 = (this->funcs_).
           super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->funcs_).
                 super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4) *
          -0x5555555555555555;
  if (uVar8 < uVar5 || uVar8 - uVar5 == 0) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar7 = TypeChecker::BeginFunction(&this->typechecker_,&local_48);
    if ((LocalDecl)
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (LocalDecl)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pTVar9 = *(pointer *)
              &pFVar3[uVar5].params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl;
    pTVar4 = *(pointer *)
              ((long)&pFVar3[uVar5].params.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
    if (pTVar9 != pTVar4) {
      do {
        pLVar2 = (this->locals_).
                 super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar2) {
          IVar6 = 1;
        }
        else {
          IVar6 = pLVar2[-1].end + 1;
        }
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar6,pTVar9->enum_);
        __position._M_current =
             (this->locals_).
             super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
          ::_M_realloc_insert<wabt::SharedValidator::LocalDecl>
                    (&this->locals_,__position,(LocalDecl *)&local_48);
        }
        else {
          *__position._M_current =
               (LocalDecl)
               local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
          ppLVar1 = &(this->locals_).
                     super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar4);
    }
    RVar7 = TypeChecker::BeginFunction
                      (&this->typechecker_,
                       &(this->funcs_).
                        super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].results);
  }
  return (Result)RVar7.enum_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = &loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}